

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  bool bVar1;
  int iVar2;
  TestResult *this_00;
  Arguments *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int *piVar3;
  DeathTestImpl *in_RDI;
  int in_stack_000000fc;
  char **in_stack_00000100;
  int gtest_retval;
  pid_t child_pid;
  Arguments args;
  string internal_flag;
  string filter_flag;
  int pipe_fd [2];
  int death_test_index;
  TestInfo *info;
  InternalRunDeathTestFlag *flag;
  UnitTestImpl *impl;
  undefined7 in_stack_fffffffffffff950;
  undefined1 in_stack_fffffffffffff957;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  undefined7 in_stack_fffffffffffff960;
  undefined1 in_stack_fffffffffffff967;
  undefined1 uVar4;
  int *in_stack_fffffffffffff978;
  allocator *streamable;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff988;
  string local_640 [39];
  undefined1 local_619 [33];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [36];
  int local_534;
  pid_t local_530;
  allocator local_529;
  string local_528 [80];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [39];
  undefined1 local_471 [33];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [39];
  allocator local_309;
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [36];
  undefined4 local_224;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [36];
  undefined4 local_134;
  string local_130 [55];
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [36];
  int local_34;
  int local_30;
  int local_2c;
  TestInfo *local_28;
  InternalRunDeathTestFlag *local_20;
  UnitTestImpl *local_18;
  TestRole local_4;
  
  local_18 = GetUnitTestImpl();
  local_20 = UnitTestImpl::internal_run_death_test_flag((UnitTestImpl *)0x133bc6);
  local_28 = UnitTestImpl::current_test_info(local_18);
  this_00 = TestInfo::result(local_28);
  local_2c = TestResult::death_test_count(this_00);
  if (local_20 == (InternalRunDeathTestFlag *)0x0) {
    do {
      iVar2 = pipe(&local_34);
      bVar1 = IsTrue(iVar2 != -1);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f8,"CHECK failed: File ",&local_f9);
        std::operator+(in_stack_fffffffffffff958,
                       (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
        std::operator+(in_stack_fffffffffffff958,
                       (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
        local_134 = 0x592;
        StreamableToString<int>(in_stack_fffffffffffff978);
        std::operator+(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
        std::operator+(in_stack_fffffffffffff958,
                       (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
        std::operator+(in_stack_fffffffffffff958,
                       (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
        DeathTestAbort((string *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
        std::__cxx11::string::~string(local_58);
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string(local_98);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::~string(local_d8);
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    do {
      iVar2 = fcntl(local_30,2,0);
      bVar1 = IsTrue(iVar2 != -1);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f8,"CHECK failed: File ",&local_1f9);
        std::operator+(in_stack_fffffffffffff958,
                       (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
        std::operator+(in_stack_fffffffffffff958,
                       (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
        local_224 = 0x595;
        StreamableToString<int>(in_stack_fffffffffffff978);
        std::operator+(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
        std::operator+(in_stack_fffffffffffff958,
                       (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
        std::operator+(in_stack_fffffffffffff958,
                       (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
        DeathTestAbort((string *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
        std::__cxx11::string::~string(local_158);
        std::__cxx11::string::~string(local_178);
        std::__cxx11::string::~string(local_198);
        std::__cxx11::string::~string(local_220);
        std::__cxx11::string::~string(local_1b8);
        std::__cxx11::string::~string(local_1d8);
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_308,"--",&local_309);
    std::operator+(in_stack_fffffffffffff958,
                   (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
    std::operator+(in_stack_fffffffffffff958,
                   (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
    std::operator+(in_stack_fffffffffffff958,
                   (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
    this_01 = (Arguments *)TestInfo::test_suite_name((TestInfo *)0x13424f);
    std::operator+(in_stack_fffffffffffff958,
                   (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
    std::operator+(in_stack_fffffffffffff958,
                   (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            TestInfo::name((TestInfo *)0x13429d);
    std::operator+(in_stack_fffffffffffff958,
                   (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_471;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_471 + 1),"--",(allocator *)__rhs);
    std::operator+(in_stack_fffffffffffff958,
                   (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
    std::operator+(in_stack_fffffffffffff958,
                   (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
    std::operator+(in_stack_fffffffffffff958,
                   (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
    std::operator+(in_stack_fffffffffffff958,
                   (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
    std::operator+(in_stack_fffffffffffff958,
                   (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
    StreamableToString<int>(in_stack_fffffffffffff978);
    std::operator+(__lhs,__rhs);
    std::operator+(in_stack_fffffffffffff958,
                   (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
    StreamableToString<int>(in_stack_fffffffffffff978);
    std::operator+(__lhs,__rhs);
    std::operator+(in_stack_fffffffffffff958,
                   (char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
    StreamableToString<int>(in_stack_fffffffffffff978);
    std::operator+(__lhs,__rhs);
    std::__cxx11::string::~string(local_4d8);
    std::__cxx11::string::~string(local_350);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::string::~string(local_4b8);
    std::__cxx11::string::~string(local_390);
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::string::~string(local_498);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::string::~string(local_3f0);
    std::__cxx11::string::~string(local_410);
    std::__cxx11::string::~string(local_430);
    std::__cxx11::string::~string(local_450);
    std::__cxx11::string::~string((string *)(local_471 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_471);
    Arguments::Arguments((Arguments *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960))
    ;
    GetArgvsForDeathTestChildProcess_abi_cxx11_();
    Arguments::AddArguments<std::__cxx11::string>
              (this_01,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__lhs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    std::__cxx11::string::c_str();
    Arguments::AddArgument((Arguments *)__rhs,(char *)in_stack_fffffffffffff978);
    std::__cxx11::string::c_str();
    Arguments::AddArgument((Arguments *)__rhs,(char *)in_stack_fffffffffffff978);
    streamable = &local_529;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_528,"",streamable);
    DeathTest::set_last_death_test_message((string *)0x13462f);
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    CaptureStderr();
    FlushInfoLog();
    Arguments::Argv((Arguments *)0x134666);
    local_530 = ExecDeathTestSpawnChild(in_stack_00000100,in_stack_000000fc);
    do {
      do {
        local_534 = close(local_30);
        uVar4 = false;
        if (local_534 == -1) {
          piVar3 = __errno_location();
          uVar4 = *piVar3 == 4;
        }
      } while ((bool)uVar4 != false);
      if (local_534 == -1) {
        __lhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_619;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_619 + 1),"CHECK failed: File ",(allocator *)__lhs_00);
        std::operator+(__lhs_00,(char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950
                                                ));
        std::operator+(__lhs_00,(char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950
                                                ));
        StreamableToString<int>((int *)streamable);
        std::operator+(__lhs,__rhs);
        std::operator+(__lhs_00,(char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950
                                                ));
        std::operator+(__lhs_00,(char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950
                                                ));
        std::operator+(__lhs_00,(char *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950
                                                ));
        DeathTestAbort((string *)CONCAT17(uVar4,in_stack_fffffffffffff960));
        std::__cxx11::string::~string(local_558);
        std::__cxx11::string::~string(local_578);
        std::__cxx11::string::~string(local_598);
        std::__cxx11::string::~string(local_5b8);
        std::__cxx11::string::~string(local_640);
        std::__cxx11::string::~string(local_5d8);
        std::__cxx11::string::~string(local_5f8);
        std::__cxx11::string::~string((string *)(local_619 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_619);
      }
      in_stack_fffffffffffff957 = AlwaysFalse();
    } while ((bool)in_stack_fffffffffffff957);
    ForkingDeathTest::set_child_pid((ForkingDeathTest *)in_RDI,local_530);
    DeathTestImpl::set_read_fd(in_RDI,local_34);
    DeathTestImpl::set_spawned(in_RDI,true);
    local_4 = OVERSEE_TEST;
    Arguments::~Arguments((Arguments *)CONCAT17(uVar4,in_stack_fffffffffffff960));
    std::__cxx11::string::~string(local_330);
    std::__cxx11::string::~string(local_248);
  }
  else {
    iVar2 = InternalRunDeathTestFlag::write_fd(local_20);
    DeathTestImpl::set_write_fd(in_RDI,iVar2);
    local_4 = EXECUTE_TEST;
  }
  return local_4;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}